

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dark.h
# Opt level: O0

string * __thiscall
bandit::colorizer::dark::good_abi_cxx11_(string *__return_storage_ptr__,dark *this)

{
  dark *this_local;
  
  backend::dark_green_abi_cxx11_(__return_storage_ptr__,(backend *)this);
  return __return_storage_ptr__;
}

Assistant:

const std::string good() const override {
        return dark_green();
      }